

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O0

void __thiscall
spvtools::opt::LoopDependenceAnalysis::MarkUnsusedDistanceEntriesAsIrrelevant
          (LoopDependenceAnalysis *this,Instruction *source,Instruction *destination,
          DistanceVector *distance_vector)

{
  pointer *this_00;
  size_t *this_01;
  ulong uVar1;
  bool bVar2;
  reference ppIVar3;
  SENode *pSVar4;
  reference ppSVar5;
  size_type sVar6;
  reference __x;
  vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_> *this_02;
  reference pvVar7;
  pair<std::_Rb_tree_const_iterator<const_spvtools::opt::Loop_*>,_bool> pVar8;
  _Self local_190;
  _Self local_188;
  ulong local_180;
  size_t i;
  undefined1 local_170;
  Loop *local_168;
  SERecurrentNode *local_160;
  SERecurrentNode *recurrent_node_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  *__range3_1;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  recurrent_nodes_1;
  SENode *destination_node;
  Instruction *destination_inst;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2_1;
  Loop *local_f0;
  SERecurrentNode *local_e8;
  SERecurrentNode *recurrent_node;
  iterator __end3;
  iterator __begin3;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  *__range3;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  recurrent_nodes;
  SENode *source_node;
  Instruction *source_inst;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  used_loops;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  destination_subscripts;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  source_subscripts;
  DistanceVector *distance_vector_local;
  Instruction *destination_local;
  Instruction *source_local;
  LoopDependenceAnalysis *this_local;
  
  GetSubscripts((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 *)&destination_subscripts.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,this,source);
  GetSubscripts((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 *)&used_loops._M_t._M_impl.super__Rb_tree_header._M_node_count,this,destination);
  memset(&__range2,0,0x30);
  std::
  set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  ::set((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
         *)&__range2);
  this_00 = &destination_subscripts.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)this_00);
  source_inst = (Instruction *)
                std::
                vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ::end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       *)this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                     *)&source_inst), bVar2) {
    ppIVar3 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    pSVar4 = ScalarEvolutionAnalysis::AnalyzeInstruction(&this->scalar_evolution_,*ppIVar3);
    recurrent_nodes.
    super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar4);
    SENode::CollectRecurrentNodes
              ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                *)&__range3,
               (SENode *)
               recurrent_nodes.
               super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __end3 = std::
             vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
             ::begin((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                      *)&__range3);
    recurrent_node =
         (SERecurrentNode *)
         std::
         vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
         ::end((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                *)&__range3);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
                                       *)&recurrent_node), bVar2) {
      ppSVar5 = __gnu_cxx::
                __normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
                ::operator*(&__end3);
      local_e8 = *ppSVar5;
      local_f0 = SERecurrentNode::GetLoop(local_e8);
      std::
      set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
      ::insert((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                *)&__range2,&local_f0);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
      ::operator++(&__end3);
    }
    std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
    ::~vector((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
               *)&__range3);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  }
  this_01 = &used_loops._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end2_1 = std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)this_01);
  destination_inst =
       (Instruction *)
       std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::end
                 ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)this_01);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                             *)&destination_inst), bVar2) {
    ppIVar3 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2_1);
    pSVar4 = ScalarEvolutionAnalysis::AnalyzeInstruction(&this->scalar_evolution_,*ppIVar3);
    recurrent_nodes_1.
    super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar4);
    SENode::CollectRecurrentNodes
              ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                *)&__range3_1,
               (SENode *)
               recurrent_nodes_1.
               super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __end3_1 = std::
               vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
               ::begin((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                        *)&__range3_1);
    recurrent_node_1 =
         (SERecurrentNode *)
         std::
         vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
         ::end((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                *)&__range3_1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
                               *)&recurrent_node_1), bVar2) {
      ppSVar5 = __gnu_cxx::
                __normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
                ::operator*(&__end3_1);
      local_160 = *ppSVar5;
      local_168 = SERecurrentNode::GetLoop(local_160);
      pVar8 = std::
              set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
              ::insert((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                        *)&__range2,&local_168);
      i = (size_t)pVar8.first._M_node;
      local_170 = pVar8.second;
      __gnu_cxx::
      __normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
      ::operator++(&__end3_1);
    }
    std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
    ::~vector((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
               *)&__range3_1);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2_1);
  }
  for (local_180 = 0; uVar1 = local_180,
      sVar6 = std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
              ::size(&this->loops_), uVar1 < sVar6; local_180 = local_180 + 1) {
    __x = std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::
          operator[](&this->loops_,local_180);
    local_188._M_node =
         (_Base_ptr)
         std::
         set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
         ::find((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                 *)&__range2,__x);
    local_190._M_node =
         (_Base_ptr)
         std::
         set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
         ::end((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                *)&__range2);
    bVar2 = std::operator==(&local_188,&local_190);
    if (bVar2) {
      this_02 = DistanceVector::GetEntries(distance_vector);
      pvVar7 = std::
               vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>::
               operator[](this_02,local_180);
      pvVar7->dependence_information = IRRELEVANT;
    }
  }
  std::
  set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  ::~set((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
          *)&__range2);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &used_loops._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &destination_subscripts.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void LoopDependenceAnalysis::MarkUnsusedDistanceEntriesAsIrrelevant(
    const Instruction* source, const Instruction* destination,
    DistanceVector* distance_vector) {
  std::vector<Instruction*> source_subscripts = GetSubscripts(source);
  std::vector<Instruction*> destination_subscripts = GetSubscripts(destination);

  std::set<const Loop*> used_loops{};

  for (Instruction* source_inst : source_subscripts) {
    SENode* source_node = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.AnalyzeInstruction(source_inst));
    std::vector<SERecurrentNode*> recurrent_nodes =
        source_node->CollectRecurrentNodes();
    for (SERecurrentNode* recurrent_node : recurrent_nodes) {
      used_loops.insert(recurrent_node->GetLoop());
    }
  }

  for (Instruction* destination_inst : destination_subscripts) {
    SENode* destination_node = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.AnalyzeInstruction(destination_inst));
    std::vector<SERecurrentNode*> recurrent_nodes =
        destination_node->CollectRecurrentNodes();
    for (SERecurrentNode* recurrent_node : recurrent_nodes) {
      used_loops.insert(recurrent_node->GetLoop());
    }
  }

  for (size_t i = 0; i < loops_.size(); ++i) {
    if (used_loops.find(loops_[i]) == used_loops.end()) {
      distance_vector->GetEntries()[i].dependence_information =
          DistanceEntry::DependenceInformation::IRRELEVANT;
    }
  }
}